

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

Am_Wrapper * __thiscall Am_Value_List_Data::Make_Unique(Am_Value_List_Data *this)

{
  uint uVar1;
  Am_Value_List_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    (this->super_Am_Wrapper).refs = uVar1 - 1;
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data()
{
  head = nullptr;
  tail = nullptr;
  number = 0;
}